

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O0

word If_Dec6Perform(word t,int fDerive)

{
  int iVar1;
  word wVar2;
  word t_00;
  word local_98;
  word local_90;
  word c1;
  word c0;
  int Var2Pla [6];
  int local_58 [2];
  int Pla2Var [6];
  int local_38;
  int Count;
  int x;
  int u;
  int v;
  int i;
  word r;
  word wStack_18;
  int fDerive_local;
  word t_local;
  
  _v = 0;
  for (u = 0; u < 6; u = u + 1) {
    iVar1 = If_Dec6HasVar(t,u);
    if (iVar1 == 0) {
      __assert_fail("If_Dec6HasVar( t, i )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDec07.c"
                    ,0x1ab,"word If_Dec6Perform(word, int)");
    }
    Var2Pla[(long)u + -2] = u;
    Pla2Var[(long)u + -2] = u;
  }
  u = 0;
  x = 0;
  wStack_18 = t;
  do {
    Count = x;
    if (5 < x) {
      if (u == 0xf) {
        return _v;
      }
      __assert_fail("i == 15",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDec07.c"
                    ,0x1c9,"word If_Dec6Perform(word, int)");
    }
    while (Count = Count + 1, Count < 6) {
      wVar2 = If_Dec6MoveTo(wStack_18,x,0,local_58,(int *)&c0);
      wStack_18 = If_Dec6MoveTo(wVar2,Count,1,local_58,(int *)&c0);
      Pla2Var[5] = If_Dec6CofCount2(wStack_18);
      if (Pla2Var[5] < 2) {
        __assert_fail("Count > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDec07.c"
                      ,0x1b7,"word If_Dec6Perform(word, int)");
      }
      if (Pla2Var[5] == 2) {
        if (fDerive == 0) {
          local_90 = 1;
        }
        else {
          local_90 = If_Dec6DeriveDisjoint(wStack_18,local_58,(int *)&c0);
        }
        return local_90;
      }
      if ((_v == 0) && ((Pla2Var[5] == 3 || (Pla2Var[5] == 4)))) {
        for (local_38 = 0; local_38 < 4; local_38 = local_38 + 1) {
          wVar2 = If_Dec6Cofactor(wStack_18,local_38 + 2,0);
          t_00 = If_Dec6Cofactor(wStack_18,local_38 + 2,1);
          iVar1 = If_Dec6CofCount2(wVar2);
          if ((iVar1 < 3) && (iVar1 = If_Dec6CofCount2(t_00), iVar1 < 3)) {
            if (fDerive == 0) {
              local_98 = 1;
            }
            else {
              local_98 = If_Dec6DeriveNonDisjoint(wStack_18,local_38 + 2,local_58,(int *)&c0);
            }
            _v = local_98;
            break;
          }
        }
      }
      u = u + 1;
    }
    x = x + 1;
  } while( true );
}

Assistant:

word If_Dec6Perform( word t, int fDerive )
{ 
    word r = 0;
    int i, v, u, x, Count, Pla2Var[6], Var2Pla[6];
    // start arrays
    for ( i = 0; i < 6; i++ )
    {
        assert( If_Dec6HasVar( t, i ) );
        Pla2Var[i] = Var2Pla[i] = i;
    }
    // generate permutations
    i = 0;
    for ( v = 0;   v < 6; v++ )
    for ( u = v+1; u < 6; u++, i++ )
    {
        t = If_Dec6MoveTo( t, v, 0, Pla2Var, Var2Pla );
        t = If_Dec6MoveTo( t, u, 1, Pla2Var, Var2Pla );
//        If_DecVerifyPerm( Pla2Var, Var2Pla );
        Count = If_Dec6CofCount2( t );
        assert( Count > 1 );
        if ( Count == 2 )
            return !fDerive ? 1 : If_Dec6DeriveDisjoint( t, Pla2Var, Var2Pla );
        // check non-disjoint decomposition
        if ( !r && (Count == 3 || Count == 4) )
        {
            for ( x = 0; x < 4; x++ )
            {
                word c0 = If_Dec6Cofactor( t, x+2, 0 );
                word c1 = If_Dec6Cofactor( t, x+2, 1 );
                if ( If_Dec6CofCount2( c0 ) <= 2 && If_Dec6CofCount2( c1 ) <= 2 )
                {
                    r = !fDerive ? 1 : If_Dec6DeriveNonDisjoint( t, x+2, Pla2Var, Var2Pla );
                    break;
                }
            }
        }
    }
    assert( i == 15 );
    return r;
}